

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O1

void __thiscall QMdi::ControlContainer::~ControlContainer(ControlContainer *this)

{
  QPointer<QWidget> *pQVar1;
  QPointer<QWidget> *pQVar2;
  Data *pDVar3;
  QObject *pQVar4;
  
  *(undefined ***)this = &PTR_metaObject_008043e8;
  pQVar4 = (QObject *)0x0;
  removeButtonsFromMenuBar(this,(QMenuBar *)0x0);
  pDVar3 = (this->m_menuLabel).wp.d;
  if (pDVar3 != (Data *)0x0) {
    if (*(int *)(pDVar3 + 4) == 0) {
      pQVar4 = (QObject *)0x0;
    }
    else {
      pQVar4 = (this->m_menuLabel).wp.value;
    }
  }
  pQVar1 = &this->m_menuLabel;
  if (pQVar4 != (QObject *)0x0) {
    (**(code **)(*(long *)pQVar4 + 0x20))(pQVar4);
  }
  pDVar3 = (pQVar1->wp).d;
  (pQVar1->wp).d = (Data *)0x0;
  (this->m_menuLabel).wp.value = (QObject *)0x0;
  if (pDVar3 != (Data *)0x0) {
    LOCK();
    *(int *)pDVar3 = *(int *)pDVar3 + -1;
    UNLOCK();
    if (*(int *)pDVar3 == 0) {
      operator_delete(pDVar3);
    }
  }
  pDVar3 = (this->m_controllerWidget).wp.d;
  if ((pDVar3 == (Data *)0x0) || (*(int *)(pDVar3 + 4) == 0)) {
    pQVar4 = (QObject *)0x0;
  }
  else {
    pQVar4 = (this->m_controllerWidget).wp.value;
  }
  pQVar2 = &this->m_controllerWidget;
  if (pQVar4 != (QObject *)0x0) {
    (**(code **)(*(long *)pQVar4 + 0x20))();
  }
  pDVar3 = (pQVar2->wp).d;
  (pQVar2->wp).d = (Data *)0x0;
  (this->m_controllerWidget).wp.value = (QObject *)0x0;
  if (pDVar3 != (Data *)0x0) {
    LOCK();
    *(int *)pDVar3 = *(int *)pDVar3 + -1;
    UNLOCK();
    if (*(int *)pDVar3 == 0) {
      operator_delete(pDVar3);
    }
  }
  pDVar3 = (this->mdiChild).wp.d;
  if (pDVar3 != (Data *)0x0) {
    LOCK();
    *(int *)pDVar3 = *(int *)pDVar3 + -1;
    UNLOCK();
    if ((*(int *)pDVar3 == 0) && (pDVar3 = (this->mdiChild).wp.d, pDVar3 != (Data *)0x0)) {
      operator_delete(pDVar3);
    }
  }
  pDVar3 = (pQVar1->wp).d;
  if (pDVar3 != (Data *)0x0) {
    LOCK();
    *(int *)pDVar3 = *(int *)pDVar3 + -1;
    UNLOCK();
    if ((*(int *)pDVar3 == 0) && (pDVar3 = (pQVar1->wp).d, pDVar3 != (Data *)0x0)) {
      operator_delete(pDVar3);
    }
  }
  pDVar3 = (pQVar2->wp).d;
  if (pDVar3 != (Data *)0x0) {
    LOCK();
    *(int *)pDVar3 = *(int *)pDVar3 + -1;
    UNLOCK();
    if ((*(int *)pDVar3 == 0) && (pDVar3 = (pQVar2->wp).d, pDVar3 != (Data *)0x0)) {
      operator_delete(pDVar3);
    }
  }
  pDVar3 = (this->m_menuBar).wp.d;
  if (pDVar3 != (Data *)0x0) {
    LOCK();
    *(int *)pDVar3 = *(int *)pDVar3 + -1;
    UNLOCK();
    if ((*(int *)pDVar3 == 0) && (pDVar3 = (this->m_menuBar).wp.d, pDVar3 != (Data *)0x0)) {
      operator_delete(pDVar3);
    }
  }
  pDVar3 = (this->previousRight).wp.d;
  if (pDVar3 != (Data *)0x0) {
    LOCK();
    *(int *)pDVar3 = *(int *)pDVar3 + -1;
    UNLOCK();
    if ((*(int *)pDVar3 == 0) && (pDVar3 = (this->previousRight).wp.d, pDVar3 != (Data *)0x0)) {
      operator_delete(pDVar3);
    }
  }
  pDVar3 = (this->previousLeft).wp.d;
  if (pDVar3 != (Data *)0x0) {
    LOCK();
    *(int *)pDVar3 = *(int *)pDVar3 + -1;
    UNLOCK();
    if ((*(int *)pDVar3 == 0) && (pDVar3 = (this->previousLeft).wp.d, pDVar3 != (Data *)0x0)) {
      operator_delete(pDVar3);
    }
  }
  QObject::~QObject(&this->super_QObject);
  return;
}

Assistant:

ControlContainer::~ControlContainer()
{
#if QT_CONFIG(menubar)
    removeButtonsFromMenuBar();
#endif
    delete m_menuLabel;
    m_menuLabel = nullptr;
    delete m_controllerWidget;
    m_controllerWidget = nullptr;
}